

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.hpp
# Opt level: O3

difference_type
ranges::
concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>
::cursor<true>::distance_to_<1ul>(long *param_1,long param_2)

{
  double *pdVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *p_Var2;
  
  if (param_1[2] == 0) {
    p_Var2 = *(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> **)
              (*param_1 + 8);
  }
  else {
    if (*(long *)(param_2 + 0x10) != 1) {
      p_Var2 = _get_::
               get<1ul,ranges::variant<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>const&>
                         ((variant<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                           *)(param_1 + 1));
      return (difference_type)p_Var2;
    }
    p_Var2 = detail::_adl_get_::
             adl_get<1ul,ranges::variant<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>const&>
                       ((variant<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                         *)(param_1 + 1));
  }
  pdVar1 = p_Var2->_M_current;
  p_Var2 = detail::_adl_get_::
           adl_get<1ul,ranges::variant<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>const&>
                     ((variant<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                       *)(param_2 + 8));
  return (long)p_Var2->_M_current - (long)pdVar1 >> 3;
}

Assistant:

static difference_type distance_to_(meta::size_t<N>, cursor const & from,
                                                cursor const & to)
            {
                if(from.its_.index() > N)
                    return cursor::distance_to_(meta::size_t<N + 1>{}, from, to);
                if(from.its_.index() == N)
                {
                    if(to.its_.index() == N)
                        return distance(ranges::get<N>(from.its_),
                                        ranges::get<N>(to.its_));
                    return distance(ranges::get<N>(from.its_),
                                    end(std::get<N>(from.rng_->rngs_))) +
                           cursor::distance_to_(meta::size_t<N + 1>{}, from, to);
                }
                if(from.its_.index() < N && to.its_.index() > N)
                    return distance(std::get<N>(from.rng_->rngs_)) +
                           cursor::distance_to_(meta::size_t<N + 1>{}, from, to);
                RANGES_EXPECT(to.its_.index() == N);
                return distance(begin(std::get<N>(from.rng_->rngs_)),
                                ranges::get<N>(to.its_));
            }